

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O3

string * __thiscall
cmCustomCommandGenerator::GetCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmCustomCommandGenerator *this,uint c)

{
  long *plVar1;
  long lVar2;
  char *__s;
  size_t sVar3;
  
  __s = GetCrossCompilingEmulator(this,c);
  if ((__s == (char *)0x0) && (__s = GetArgv0Location(this,c), __s == (char *)0x0)) {
    plVar1 = *(long **)&(this->CommandLines).
                        super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                        ._M_impl.super__Vector_impl_data._M_start[c].
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar2 = *plVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,lVar2,plVar1[1] + lVar2);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar3 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,__s + sVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCustomCommandGenerator::GetCommand(unsigned int c) const
{
  if (const char* emulator = this->GetCrossCompilingEmulator(c)) {
    return std::string(emulator);
  }
  if (const char* location = this->GetArgv0Location(c)) {
    return std::string(location);
  }

  return this->CommandLines[c][0];
}